

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::CumulativeReporterBase
          (CumulativeReporterBase<Catch::JunitReporter> *this,ReporterConfig *_config)

{
  ostream *poVar1;
  element_type *peVar2;
  size_type sVar3;
  ReusableStringStream *this_00;
  ReusableStringStream local_90;
  string local_78;
  key_type local_58 [4];
  set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_> local_48;
  ReporterConfig *local_18;
  ReporterConfig *_config_local;
  CumulativeReporterBase<Catch::JunitReporter> *this_local;
  
  local_18 = _config;
  _config_local = (ReporterConfig *)this;
  IStreamingReporter::IStreamingReporter(&this->super_IStreamingReporter);
  (this->super_IStreamingReporter)._vptr_IStreamingReporter =
       (_func_int **)&PTR__CumulativeReporterBase_003ac580;
  ReporterConfig::fullConfig((ReporterConfig *)&this->m_config);
  poVar1 = ReporterConfig::stream(local_18);
  this->stream = poVar1;
  clara::std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::vector
            (&this->m_assertions);
  clara::std::
  vector<std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>,_std::allocator<std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
  ::vector(&this->m_sections);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
  ::vector(&this->m_testCases);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
  ::vector(&this->m_testGroups);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>_>
  ::vector(&this->m_testRuns);
  clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
  shared_ptr(&this->m_rootSection);
  clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
  shared_ptr(&this->m_deepestSection);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
  ::vector(&this->m_sectionStack);
  ReporterPreferences::ReporterPreferences(&this->m_reporterPrefs);
  (this->m_reporterPrefs).shouldRedirectStdOut = false;
  getSupportedVerbosities();
  peVar2 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_config);
  local_58[0] = (*(peVar2->super_NonCopyable)._vptr_NonCopyable[0x14])();
  sVar3 = clara::std::
          set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>::
          count(&local_48,local_58);
  clara::std::set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
  ::~set(&local_48);
  if (sVar3 != 0) {
    return;
  }
  ReusableStringStream::ReusableStringStream(&local_90);
  this_00 = ReusableStringStream::operator<<
                      (&local_90,(char (*) [47])"Verbosity level not supported by this reporter");
  ReusableStringStream::str_abi_cxx11_(&local_78,this_00);
  throw_domain_error(&local_78);
}

Assistant:

CumulativeReporterBase( ReporterConfig const& _config )
        :   m_config( _config.fullConfig() ),
            stream( _config.stream() )
        {
            m_reporterPrefs.shouldRedirectStdOut = false;
            if( !DerivedT::getSupportedVerbosities().count( m_config->verbosity() ) )
                CATCH_ERROR( "Verbosity level not supported by this reporter" );
        }